

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::EnumDescriptorProto::_InternalParse
          (EnumDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  byte bVar2;
  int iVar3;
  Rep *pRVar4;
  string *s;
  EnumOptions *pEVar5;
  EnumDescriptorProto_EnumReservedRange *msg;
  EnumValueDescriptorProto *msg_00;
  char cVar6;
  uint32 res;
  uint tag;
  byte *p;
  Arena *pAVar7;
  pair<const_char_*,_unsigned_int> pVar8;
  pair<const_char_*,_bool> pVar9;
  
  this_00 = &this->name_;
  do {
    if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
      pVar9._8_8_ = 0;
      pVar9.first = ptr;
    }
    else {
      pVar9._8_8_ = 1;
      pVar9.first = ptr;
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        pVar9 = internal::EpsCopyInputStream::DoneFallback
                          (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      }
    }
    p = (byte *)pVar9.first;
    if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      return (char *)p;
    }
    bVar1 = *p;
    pVar8.second._0_1_ = bVar1;
    pVar8.first = (char *)(p + 1);
    pVar8._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = p[1];
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar8 = internal::ReadTagFallback((char *)p,res);
      }
      else {
        pVar8.second = res;
        pVar8.first = (char *)(p + 2);
        pVar8._12_4_ = 0;
      }
    }
    ptr = pVar8.first;
    if (ptr == (char *)0x0) {
LAB_002fd727:
      cVar6 = '\x04';
    }
    else {
      tag = pVar8.second;
      cVar6 = (char)pVar8.second;
      switch((uint)(pVar8._8_8_ >> 3) & 0x1fffffff) {
      case 1:
        if (cVar6 != '\n') break;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        pAVar7 = (Arena *)(this->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          .ptr_;
        if (((ulong)pAVar7 & 1) != 0) {
          pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
        }
        if (this_00->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_00,pAVar7,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        ptr = internal::InlineGreedyStringParser(this_00->ptr_,ptr,ctx);
        goto LAB_002fd70a;
      case 2:
        if (cVar6 == '\x12') {
          ptr = ptr + -1;
          do {
            pRVar4 = (this->value_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar4 == (Rep *)0x0) {
LAB_002fd65a:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->value_).super_RepeatedPtrFieldBase,
                         (this->value_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002fd66a:
              pRVar4 = (this->value_).super_RepeatedPtrFieldBase.rep_;
              pRVar4->allocated_size = pRVar4->allocated_size + 1;
              msg_00 = Arena::CreateMaybeMessage<google::protobuf::EnumValueDescriptorProto>
                                 ((this->value_).super_RepeatedPtrFieldBase.arena_);
              pRVar4 = (this->value_).super_RepeatedPtrFieldBase.rep_;
              iVar3 = (this->value_).super_RepeatedPtrFieldBase.current_size_;
              (this->value_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              pRVar4->elements[iVar3] = msg_00;
            }
            else {
              iVar3 = (this->value_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar4->allocated_size <= iVar3) {
                if (pRVar4->allocated_size == (this->value_).super_RepeatedPtrFieldBase.total_size_)
                goto LAB_002fd65a;
                goto LAB_002fd66a;
              }
              (this->value_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              msg_00 = (EnumValueDescriptorProto *)pRVar4->elements[iVar3];
            }
            ptr = internal::ParseContext::ParseMessage<google::protobuf::EnumValueDescriptorProto>
                            (ctx,msg_00,ptr + 1);
            if (ptr == (char *)0x0) goto LAB_002fd727;
            cVar6 = '\x02';
          } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == '\x12'));
          goto LAB_002fd71c;
        }
        break;
      case 3:
        if (cVar6 == '\x1a') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          if (this->options_ == (EnumOptions *)0x0) {
            pAVar7 = (Arena *)(this->_internal_metadata_).
                              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                              .ptr_;
            if (((ulong)pAVar7 & 1) != 0) {
              pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
            }
            pEVar5 = Arena::CreateMaybeMessage<google::protobuf::EnumOptions>(pAVar7);
            this->options_ = pEVar5;
          }
          ptr = internal::ParseContext::ParseMessage<google::protobuf::EnumOptions>
                          (ctx,this->options_,ptr);
          goto LAB_002fd70a;
        }
        break;
      case 4:
        if (cVar6 == '\"') {
          ptr = ptr + -1;
          do {
            pRVar4 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar4 == (Rep *)0x0) {
LAB_002fd5b1:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->reserved_range_).super_RepeatedPtrFieldBase,
                         (this->reserved_range_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002fd5c1:
              pRVar4 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
              pRVar4->allocated_size = pRVar4->allocated_size + 1;
              msg = Arena::
                    CreateMaybeMessage<google::protobuf::EnumDescriptorProto_EnumReservedRange>
                              ((this->reserved_range_).super_RepeatedPtrFieldBase.arena_);
              pRVar4 = (this->reserved_range_).super_RepeatedPtrFieldBase.rep_;
              iVar3 = (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
              (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              pRVar4->elements[iVar3] = msg;
            }
            else {
              iVar3 = (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar4->allocated_size <= iVar3) {
                if (pRVar4->allocated_size ==
                    (this->reserved_range_).super_RepeatedPtrFieldBase.total_size_)
                goto LAB_002fd5b1;
                goto LAB_002fd5c1;
              }
              (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              msg = (EnumDescriptorProto_EnumReservedRange *)pRVar4->elements[iVar3];
            }
            ptr = internal::ParseContext::
                  ParseMessage<google::protobuf::EnumDescriptorProto_EnumReservedRange>
                            (ctx,msg,ptr + 1);
            if (ptr == (char *)0x0) goto LAB_002fd727;
            cVar6 = '\x02';
          } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == '\"'));
          goto LAB_002fd71c;
        }
        break;
      case 5:
        if (cVar6 == '*') {
          ptr = ptr + -1;
          do {
            pRVar4 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar4 == (Rep *)0x0) {
LAB_002fd496:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->reserved_name_).super_RepeatedPtrFieldBase,
                         (this->reserved_name_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002fd4a4:
              pRVar4 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
              pRVar4->allocated_size = pRVar4->allocated_size + 1;
              pAVar7 = (this->reserved_name_).super_RepeatedPtrFieldBase.arena_;
              if (pAVar7 == (Arena *)0x0) {
                s = (string *)operator_new(0x20);
              }
              else {
                if (pAVar7->hooks_cookie_ != (void *)0x0) {
                  Arena::OnArenaAllocation(pAVar7,(type_info *)&std::__cxx11::string::typeinfo,0x20)
                  ;
                }
                s = (string *)
                    internal::ArenaImpl::AllocateAlignedAndAddCleanup
                              (&pAVar7->impl_,0x20,
                               internal::arena_destruct_object<std::__cxx11::string>);
              }
              (s->_M_dataplus)._M_p = (pointer)&s->field_2;
              s->_M_string_length = 0;
              (s->field_2)._M_local_buf[0] = '\0';
              pRVar4 = (this->reserved_name_).super_RepeatedPtrFieldBase.rep_;
              iVar3 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
              (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              pRVar4->elements[iVar3] = s;
            }
            else {
              iVar3 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar4->allocated_size <= iVar3) {
                if (pRVar4->allocated_size ==
                    (this->reserved_name_).super_RepeatedPtrFieldBase.total_size_)
                goto LAB_002fd496;
                goto LAB_002fd4a4;
              }
              (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              s = (string *)pRVar4->elements[iVar3];
            }
            ptr = internal::InlineGreedyStringParser(s,ptr + 1,ctx);
            if (ptr == (char *)0x0) goto LAB_002fd727;
            cVar6 = '\x02';
          } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == '*'));
          goto LAB_002fd71c;
        }
      }
      if (tag == 0 || (tag & 7) == 4) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        cVar6 = '\r';
      }
      else {
        ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr,ctx);
LAB_002fd70a:
        cVar6 = (ptr == (char *)0x0) * '\x02' + '\x02';
      }
    }
LAB_002fd71c:
    if (cVar6 != '\x02') {
      if (cVar6 == '\x04') {
        ptr = (char *)0x0;
      }
      return ptr;
    }
  } while( true );
}

Assistant:

const char* EnumDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.EnumDescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.EnumValueDescriptorProto value = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_value(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.EnumOptions options = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.EnumDescriptorProto.EnumReservedRange reserved_range = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_reserved_range(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<34>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated string reserved_name = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_reserved_name(), ptr, ctx, "google.protobuf.EnumDescriptorProto.reserved_name");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<42>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}